

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileColliderTests.cpp
# Opt level: O3

void __thiscall
solitaire::colliders::TableauPileColliderCollidedCardTests_getCollidedCardIndex_Test::
~TableauPileColliderCollidedCardTests_getCollidedCardIndex_Test
          (TableauPileColliderCollidedCardTests_getCollidedCardIndex_Test *this)

{
  unique_ptr<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  *this_00;
  
  this_00 = &this[-1].super_TableauPileColliderCollidedCardTests.super_TableauPileColliderTests.
             super_Test.gtest_flag_saver_;
  this[-1].super_TableauPileColliderCollidedCardTests.super_TableauPileColliderTests.super_Test.
  gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&PTR__TableauPileColliderTests_00321180;
  this[-1].super_TableauPileColliderCollidedCardTests.super_TableauPileColliderTests.tableauPileMock
  .gmock02_initialize_11.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__TableauPileMock_0031be78;
  testing::internal::FunctionMocker<bool_()>::~FunctionMocker
            ((FunctionMocker<bool_()> *)
             &this[-1].super_TableauPileColliderCollidedCardTests.super_TableauPileColliderTests.
              tableauPileMock.gmock10_isTopCardCovered_19.super_UntypedFunctionMockerBase.mock_obj_)
  ;
  testing::internal::FunctionMocker<unsigned_int_()>::~FunctionMocker
            ((FunctionMocker<unsigned_int_()> *)
             &this[-1].super_TableauPileColliderCollidedCardTests.super_TableauPileColliderTests.
              tableauPileMock.gmock10_getTopCoveredCardPosition_18.super_UntypedFunctionMockerBase.
              mock_obj_);
  testing::internal::
  FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  ::~FunctionMocker((FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                     *)&this[-1].super_TableauPileColliderCollidedCardTests.
                        super_TableauPileColliderTests.tableauPileMock.gmock10_getCards_17.
                        super_UntypedFunctionMockerBase.mock_obj_);
  testing::internal::
  FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::~FunctionMocker((FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
                     *)&this[-1].super_TableauPileColliderCollidedCardTests.
                        super_TableauPileColliderTests.tableauPileMock.gmock01_tryPullOutCards_16.
                        super_UntypedFunctionMockerBase.mock_obj_);
  testing::internal::
  FunctionMocker<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
  ::~FunctionMocker((FunctionMocker<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
                     *)&this[-1].super_TableauPileColliderCollidedCardTests.
                        super_TableauPileColliderTests.tableauPileMock.gmock01_tryAddCards_15.
                        super_UntypedFunctionMockerBase.mock_obj_);
  testing::internal::FunctionMocker<void_()>::~FunctionMocker
            ((FunctionMocker<void_()> *)
             &this[-1].super_TableauPileColliderCollidedCardTests.super_TableauPileColliderTests.
              tableauPileMock.gmock00_tryUncoverTopCard_14.super_UntypedFunctionMockerBase.mock_obj_
            );
  testing::internal::
  FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  ::~FunctionMocker((FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
                     *)&this[-1].super_TableauPileColliderCollidedCardTests.
                        super_TableauPileColliderTests.tableauPileMock.gmock00_createSnapshot_13.
                        super_UntypedFunctionMockerBase.mock_obj_);
  testing::internal::
  FunctionMocker<void_(const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&)>
  ::~FunctionMocker((FunctionMocker<void_(const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&)>
                     *)&this[-1].super_TableauPileColliderCollidedCardTests.
                        super_TableauPileColliderTests.tableauPileMock.gmock02_initialize_11.
                        super_UntypedFunctionMockerBase.mock_obj_);
  testing::Test::~Test((Test *)this_00);
  operator_delete(this_00,0x278);
  return;
}

Assistant:

TEST_P(TableauPileColliderCollidedCardTests, getCollidedCardIndex) {
    const auto& collidedCardData = GetParam();
    Cards cards {collidedCardData.cardsQuantity};

    EXPECT_CALL(tableauPileMock, getCards()).WillRepeatedly(ReturnRef(cards));
    EXPECT_CALL(tableauPileMock, getTopCoveredCardPosition())
        .WillRepeatedly(Return(collidedCardData.topCoveredCardPosition));

    EXPECT_EQ(
        collider.tryGetCollidedCardIndex(collidedCardData.collidedPosition),
        collidedCardData.cardIndex
    );
}